

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_utils.c
# Opt level: O0

char * vrna_basename(char *path)

{
  char *pcVar1;
  char *ptr;
  char *name;
  char *path_local;
  
  ptr = (char *)0x0;
  if (path != (char *)0x0) {
    pcVar1 = strrchr(path,0x2f);
    if ((pcVar1 == (char *)0x0) || (pcVar1[1] == '\0')) {
      if (pcVar1 == (char *)0x0) {
        ptr = strdup(path);
      }
    }
    else {
      ptr = strdup(pcVar1 + 1);
    }
  }
  return ptr;
}

Assistant:

PUBLIC char *
vrna_basename(const char *path)
{
  char *name, *ptr;

  name = NULL;

  if (path) {
    ptr = strrchr(path, DIRSEPC);

    if (ptr && (*(ptr + 1) != '\0'))
      name = strdup(ptr + 1);
    else if (!ptr)
      name = strdup(path);
  }

  return name;
}